

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_act(parser *p)

{
  activation *paVar1;
  int local_24;
  wchar_t count;
  activation *next;
  activation *act;
  parser *p_local;
  
  local_24 = 1;
  z_info->act_max = 0;
  for (next = (activation *)parser_priv(p); next != (activation *)0x0; next = next->next) {
    z_info->act_max = z_info->act_max + 1;
  }
  activations = (activation *)mem_zalloc((long)(int)(z_info->act_max + 1) * 0x38);
  next = (activation *)parser_priv(p);
  while (next != (activation *)0x0) {
    memcpy(activations + local_24,next,0x38);
    activations[local_24].index = local_24;
    paVar1 = next->next;
    if (paVar1 == (activation *)0x0) {
      activations[local_24].next = (activation *)0x0;
    }
    else {
      activations[local_24].next = activations + (local_24 + 1);
    }
    mem_free(next);
    local_24 = local_24 + 1;
    next = paVar1;
  }
  z_info->act_max = z_info->act_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_act(struct parser *p) {
	struct activation *act, *next = NULL;
	int count = 1;

	/* Count the entries */
	z_info->act_max = 0;
	act = parser_priv(p);
	while (act) {
		z_info->act_max++;
		act = act->next;
	}

	/* Allocate the direct access list and copy the data to it */
	activations = mem_zalloc((z_info->act_max + 1) * sizeof(*act));
	for (act = parser_priv(p); act; act = next, count++) {
		memcpy(&activations[count], act, sizeof(*act));
		activations[count].index = count;
		next = act->next;
		if (next) {
			activations[count].next = &activations[count + 1];
		} else {
			activations[count].next = NULL;
		}
		mem_free(act);
	}
	z_info->act_max += 1;

	parser_destroy(p);
	return 0;
}